

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-lstm.cc
# Opt level: O0

void __thiscall cnn::FastLSTMBuilder::new_graph_impl(FastLSTMBuilder *this,ComputationGraph *cg)

{
  initializer_list<cnn::expr::Expression> __l;
  Parameters *in_RSI;
  long in_RDI;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> vars;
  Expression i_bc;
  Expression i_h2c;
  Expression i_x2c;
  Expression i_bo;
  Expression i_c2o;
  Expression i_h2o;
  Expression i_x2o;
  Expression i_bi;
  Expression i_c2i;
  Expression i_h2i;
  Expression i_x2i;
  value_type *p;
  uint i;
  Parameters *pPVar1;
  Parameters *this_00;
  Parameters *__x;
  Parameters *in_stack_fffffffffffffd90;
  Parameters *in_stack_fffffffffffffd98;
  Parameters *__a;
  Parameters *this_01;
  Parameters *pPVar2;
  Parameters *pPVar3;
  undefined1 local_1a8 [176];
  undefined1 *local_f8;
  undefined8 local_f0;
  reference local_20;
  uint local_14;
  Parameters *local_10;
  
  local_10 = in_RSI;
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::clear((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
           *)0x3beba0);
  for (local_14 = 0; local_14 < *(uint *)(in_RDI + 0xc0); local_14 = local_14 + 1) {
    local_20 = std::
               vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
               ::operator[]((vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
                             *)(in_RDI + 0x28),(ulong)local_14);
    pPVar1 = local_10;
    std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::operator[](local_20,0);
    expr::parameter((ComputationGraph *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
    this_00 = local_10;
    std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::operator[](local_20,1);
    expr::parameter((ComputationGraph *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
    __x = local_10;
    std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::operator[](local_20,2);
    expr::parameter((ComputationGraph *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
    in_stack_fffffffffffffd90 = local_10;
    std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::operator[](local_20,3);
    expr::parameter((ComputationGraph *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
    in_stack_fffffffffffffd98 = local_10;
    std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::operator[](local_20,4);
    expr::parameter((ComputationGraph *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
    std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::operator[](local_20,5);
    expr::parameter((ComputationGraph *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
    __a = local_10;
    std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::operator[](local_20,6);
    expr::parameter((ComputationGraph *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
    this_01 = local_10;
    std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::operator[](local_20,7);
    expr::parameter((ComputationGraph *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
    pPVar2 = local_10;
    std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::operator[](local_20,8);
    expr::parameter((ComputationGraph *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
    pPVar3 = local_10;
    std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::operator[](local_20,9);
    expr::parameter((ComputationGraph *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
    std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::operator[](local_20,10);
    expr::parameter((ComputationGraph *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
    expr::Expression::Expression((Expression *)this_00,(Expression *)pPVar1);
    expr::Expression::Expression((Expression *)this_00,(Expression *)pPVar1);
    expr::Expression::Expression((Expression *)this_00,(Expression *)pPVar1);
    expr::Expression::Expression((Expression *)this_00,(Expression *)pPVar1);
    expr::Expression::Expression((Expression *)this_00,(Expression *)pPVar1);
    expr::Expression::Expression((Expression *)this_00,(Expression *)pPVar1);
    expr::Expression::Expression((Expression *)this_00,(Expression *)pPVar1);
    expr::Expression::Expression((Expression *)this_00,(Expression *)pPVar1);
    expr::Expression::Expression((Expression *)this_00,(Expression *)pPVar1);
    expr::Expression::Expression((Expression *)this_00,(Expression *)pPVar1);
    expr::Expression::Expression((Expression *)this_00,(Expression *)pPVar1);
    local_f0 = 0xb;
    local_f8 = local_1a8;
    std::allocator<cnn::expr::Expression>::allocator((allocator<cnn::expr::Expression> *)0x3bef7b);
    __l._M_len = (size_type)pPVar3;
    __l._M_array = (iterator)pPVar2;
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
              ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)this_01,__l,
               (allocator_type *)__a);
    std::allocator<cnn::expr::Expression>::~allocator((allocator<cnn::expr::Expression> *)0x3befaf);
    std::
    vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
    ::push_back((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 *)in_stack_fffffffffffffd90,(value_type *)__x);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~vector
              ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
               in_stack_fffffffffffffd90);
  }
  return;
}

Assistant:

void FastLSTMBuilder::new_graph_impl(ComputationGraph& cg){
  param_vars.clear();

  for (unsigned i = 0; i < layers; ++i){
    auto& p = params[i];

    //i
    Expression i_x2i = parameter(cg,p[X2I]);
    Expression i_h2i = parameter(cg,p[H2I]);
    Expression i_c2i = parameter(cg,p[C2I]);
    Expression i_bi = parameter(cg,p[BI]);
    //o
    Expression i_x2o = parameter(cg,p[X2O]);
    Expression i_h2o = parameter(cg,p[H2O]);
    Expression i_c2o = parameter(cg,p[C2O]);
    Expression i_bo = parameter(cg,p[BO]);
    //c
    Expression i_x2c = parameter(cg,p[X2C]);
    Expression i_h2c = parameter(cg,p[H2C]);
    Expression i_bc = parameter(cg,p[BC]);

    vector<Expression> vars = {i_x2i, i_h2i, i_c2i, i_bi, i_x2o, i_h2o, i_c2o, i_bo, i_x2c, i_h2c, i_bc};
    param_vars.push_back(vars);
  }
}